

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall
btSoftBody::appendAngularJoint(btSoftBody *this,Specs *specs,Cluster *body0,Body body1)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  Cluster *in_RDX;
  undefined4 *in_RSI;
  Body *in_RDI;
  btVector3 bVar3;
  AJoint *pj;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 *size;
  btTransform *this_00;
  btMatrix3x3 *in_stack_ffffffffffffff10;
  btTransform *this_01;
  AJoint *in_stack_ffffffffffffff20;
  btTransform local_d8;
  btTransform *in_stack_ffffffffffffff68;
  btTransform local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  Body local_38;
  undefined8 *local_20;
  Cluster *local_18;
  undefined4 *local_10;
  
  size = (undefined8 *)&stack0x00000008;
  local_18 = in_RDX;
  local_10 = in_RSI;
  puVar2 = (undefined8 *)
           btAlignedAllocInternal((size_t)size,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  puVar2[0x1a] = 0;
  puVar2[0x1b] = 0;
  puVar2[0x18] = 0;
  puVar2[0x19] = 0;
  puVar2[0x16] = 0;
  puVar2[0x17] = 0;
  puVar2[0x14] = 0;
  puVar2[0x15] = 0;
  puVar2[0x12] = 0;
  puVar2[0x13] = 0;
  puVar2[0x10] = 0;
  puVar2[0x11] = 0;
  puVar2[0xe] = 0;
  puVar2[0xf] = 0;
  puVar2[0xc] = 0;
  puVar2[0xd] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  AJoint::AJoint(in_stack_ffffffffffffff20);
  local_20 = puVar2;
  Body::Body(&local_38,local_18);
  local_20[3] = local_38.m_collisionObject;
  local_20[1] = local_38.m_soft;
  local_20[2] = local_38.m_rigid;
  local_20[6] = size[2];
  uVar1 = size[1];
  local_20[4] = *size;
  local_20[5] = uVar1;
  Body::xform(in_RDI);
  this_00 = &local_88;
  btTransform::inverse(in_stack_ffffffffffffff68);
  btTransform::getBasis(this_00);
  bVar3 = ::operator*(in_stack_ffffffffffffff10,(btVector3 *)this_00);
  uStack_40 = bVar3.m_floats._8_8_;
  local_48 = bVar3.m_floats._0_8_;
  local_20[7] = local_48;
  local_20[8] = uStack_40;
  Body::xform(in_RDI);
  this_01 = &local_d8;
  btTransform::inverse(in_stack_ffffffffffffff68);
  btTransform::getBasis(this_01);
  bVar3 = ::operator*(&this_01->m_basis,(btVector3 *)this_00);
  local_20[9] = bVar3.m_floats._0_8_;
  local_20[10] = bVar3.m_floats._8_8_;
  *(undefined4 *)(local_20 + 0xb) = local_10[1];
  *(undefined4 *)((long)local_20 + 0x5c) = *local_10;
  *(undefined4 *)(local_20 + 0xc) = local_10[2];
  local_20[0x1b] = *(undefined8 *)(local_10 + 8);
  btAlignedObjectArray<btSoftBody::Joint_*>::push_back
            ((btAlignedObjectArray<btSoftBody::Joint_*> *)this_01,(Joint **)this_00);
  return;
}

Assistant:

void			btSoftBody::appendAngularJoint(const AJoint::Specs& specs,Cluster* body0,Body body1)
{
	AJoint*		pj	=	new(btAlignedAlloc(sizeof(AJoint),16)) AJoint();
	pj->m_bodies[0]	=	body0;
	pj->m_bodies[1]	=	body1;
	pj->m_refs[0]	=	pj->m_bodies[0].xform().inverse().getBasis()*specs.axis;
	pj->m_refs[1]	=	pj->m_bodies[1].xform().inverse().getBasis()*specs.axis;
	pj->m_cfm		=	specs.cfm;
	pj->m_erp		=	specs.erp;
	pj->m_split		=	specs.split;
	pj->m_icontrol	=	specs.icontrol;
	m_joints.push_back(pj);
}